

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_server_async.cpp
# Opt level: O2

void __thiscall Session::DoWrite(Session *this,size_t length)

{
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [2];
  _Bind<void_(Session::*(std::shared_ptr<Session>,_std::_Placeholder<1>,_std::_Placeholder<2>))(boost::system::error_code,_unsigned_long)>
  local_50;
  mutable_buffer local_30;
  
  local_30.size_ = 0x400;
  if (length < 0x400) {
    local_30.size_ = length;
  }
  local_30.data_ = &this->buffer_;
  std::__shared_ptr<Session,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Session,void>
            ((__shared_ptr<Session,(__gnu_cxx::_Lock_policy)2> *)&local_68,
             (__weak_ptr<Session,_(__gnu_cxx::_Lock_policy)2> *)this);
  local_50._M_f = (offset_in_Session_to_subr)OnWrite;
  local_50._8_8_ = 0;
  local_50._M_bound_args.
  super__Tuple_impl<0UL,_std::shared_ptr<Session>,_std::_Placeholder<1>,_std::_Placeholder<2>_>.
  super__Head_base<0UL,_std::shared_ptr<Session>,_false>._M_head_impl.
  super___shared_ptr<Session,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_68;
  local_50._M_bound_args.
  super__Tuple_impl<0UL,_std::shared_ptr<Session>,_std::_Placeholder<1>,_std::_Placeholder<2>_>.
  super__Head_base<0UL,_std::shared_ptr<Session>,_false>._M_head_impl.
  super___shared_ptr<Session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = a_Stack_60[0]._M_pi;
  local_68 = (element_type *)0x0;
  a_Stack_60[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  boost::asio::
  async_write<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::mutable_buffer,std::_Bind<void(Session::*(std::shared_ptr<Session>,std::_Placeholder<1>,std::_Placeholder<2>))(boost::system::error_code,unsigned_long)>>
            (&this->socket_,&local_30,&local_50,(type *)0x0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&local_50._M_bound_args.
                     super__Tuple_impl<0UL,_std::shared_ptr<Session>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                     .super__Head_base<0UL,_std::shared_ptr<Session>,_false>._M_head_impl.
                     super___shared_ptr<Session,_(__gnu_cxx::_Lock_policy)2> + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_60);
  return;
}

Assistant:

void DoWrite(std::size_t length) {
#if USE_BIND
    boost::asio::async_write(socket_,
                             boost::asio::buffer(buffer_, length),
                             std::bind(&Session::OnWrite, shared_from_this(),
                                       std::placeholders::_1,
                                       std::placeholders::_2));
#else
    auto self(shared_from_this());

    boost::asio::async_write(
        socket_,
        boost::asio::buffer(buffer_, length),
        [this, self](boost::system::error_code ec, std::size_t /*length*/) {
          if (!ec) {
            AsyncRead();
          }
        });
#endif  // USE_BIND
  }